

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool q_evaluateRhiConfigRecursive
               (QWidget *w,QPlatformBackingStoreRhiConfig *outConfig,SurfaceType *outType)

{
  long lVar1;
  long lVar2;
  QWidget *w_00;
  bool bVar3;
  SurfaceType SVar4;
  int iVar5;
  bool extraout_DL;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QPlatformBackingStoreRhiConfig local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_debugLayer = true;
  local_48._9_3_ = 0xaaaaaa;
  local_48._0_8_ = (**(code **)(**(long **)&w->field_0x8 + 0x40))();
  local_48.m_debugLayer = extraout_DL;
  if ((local_48._0_8_ & 1) == 0) {
    lVar1 = *(long *)(*(long *)&w->field_0x8 + 0x20);
    lVar2 = *(long *)(*(long *)&w->field_0x8 + 0x28);
    for (lVar6 = 0; bVar7 = lVar2 << 3 != lVar6, bVar7; lVar6 = lVar6 + 8) {
      w_00 = *(QWidget **)(lVar1 + lVar6);
      if ((w_00 != (QWidget *)0x0) && ((*(byte *)(*(long *)&w_00->field_0x8 + 0x30) & 1) != 0)) {
        bVar3 = q_evaluateRhiConfigRecursive(w_00,outConfig,outType);
        if (bVar3) {
          if (q_evaluateRhiConfigRecursive(QWidget_const*,QPlatformBackingStoreRhiConfig*,QSurface::SurfaceType*)
              ::optOut == '\0') {
            iVar5 = __cxa_guard_acquire(&q_evaluateRhiConfigRecursive(QWidget_const*,QPlatformBackingStoreRhiConfig*,QSurface::SurfaceType*)
                                         ::optOut);
            if (iVar5 != 0) {
              q_evaluateRhiConfigRecursive::optOut =
                   (bool)qEnvironmentVariableIsSet("QT_WIDGETS_NO_CHILD_RHI");
              __cxa_guard_release(&q_evaluateRhiConfigRecursive(QWidget_const*,QPlatformBackingStoreRhiConfig*,QSurface::SurfaceType*)
                                   ::optOut);
            }
          }
          if ((q_evaluateRhiConfigRecursive::optOut != false) ||
             ((*(byte *)(*(long *)&w_00->field_0x8 + 0x248) & 0x10) == 0)) break;
        }
      }
    }
  }
  else {
    if (outConfig != (QPlatformBackingStoreRhiConfig *)0x0) {
      outConfig->m_debugLayer = extraout_DL;
      outConfig->m_enable = (bool)(char)local_48._0_8_;
      *(int3 *)&outConfig->field_0x1 = (int3)((ulong)local_48._0_8_ >> 8);
      outConfig->m_api = (int)((ulong)local_48._0_8_ >> 0x20);
    }
    bVar7 = true;
    if (outType != (SurfaceType *)0x0) {
      SVar4 = QBackingStoreRhiSupport::surfaceTypeForConfig(&local_48);
      *outType = SVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

static bool q_evaluateRhiConfigRecursive(const QWidget *w, QPlatformBackingStoreRhiConfig *outConfig, QSurface::SurfaceType *outType)
{
    QPlatformBackingStoreRhiConfig config = QWidgetPrivate::get(w)->rhiConfig();
    if (config.isEnabled()) {
        if (outConfig)
            *outConfig = config;
        if (outType)
            *outType = QBackingStoreRhiSupport::surfaceTypeForConfig(config);
        return true;
    }
    for (const QObject *child : w->children()) {
        if (const QWidget *childWidget = qobject_cast<const QWidget *>(child)) {
            if (q_evaluateRhiConfigRecursive(childWidget, outConfig, outType)) {
                static bool optOut = qEnvironmentVariableIsSet("QT_WIDGETS_NO_CHILD_RHI");
                // Native child widgets should not trigger RHI for its parent
                // hierarchy, but will still flush the native child using RHI.
                if (!optOut && childWidget->testAttribute(Qt::WA_NativeWindow))
                    continue;

                return true;
            }
        }
    }
    return false;
}